

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

_Bool find_value_arg(char *value_name,char *string,size_t nstring,int *num)

{
  long lVar1;
  long lv;
  char *tc_1;
  char *tc;
  char *to;
  int *num_local;
  size_t nstring_local;
  char *string_local;
  char *value_name_local;
  
  to = (char *)num;
  num_local = (int *)nstring;
  nstring_local = (size_t)string;
  string_local = value_name;
  tc = strchr(value_name,0x5b);
  if (tc == (char *)0x0) {
    return false;
  }
  if (nstring_local == 0) {
    if (to == (char *)0x0) {
      return false;
    }
    lVar1 = strtol(tc + 1,(char **)&lv,10);
    if (((*(char *)lv != ']') || (lVar1 < -0x7fffffff)) || (0x7ffffffe < lVar1)) {
      return false;
    }
    *(int *)to = (int)lVar1;
  }
  else {
    tc_1 = strchr(tc + 1,0x5d);
    if ((tc_1 == (char *)0x0) || (num_local < tc_1 + -(long)tc)) {
      return false;
    }
    memcpy((void *)nstring_local,tc + 1,(long)tc_1 - (long)(tc + 1));
    tc_1[nstring_local - (long)(tc + 1)] = '\0';
  }
  *tc = '\0';
  return true;
}

Assistant:

static bool find_value_arg(char *value_name, char *string, size_t nstring,
		int *num)
{
	/* Find the first bracket */
	char *to = strchr(value_name, '[');

	if (!to) {
		return false;
	}

	/* Choose random_value value or int or fail */
	if (string) {
		/* Find the closing bracket. */
		char *tc = strchr(to + 1, ']');

		if (!tc || (size_t)(tc - to) > nstring) {
			return false;
		}
		/* Get the dice */
		memcpy(string, to + 1, tc - (to + 1));
		string[tc - (to + 1)] = '\0';
	} else if (num) {
		/* Get the value */
		char *tc;
		long lv = strtol(to + 1, &tc, 10);

		/*
		 * Also reject INT_MIN and INT_MAX so don't have to check errno
		 * to detect overflow when sizeof(long) == sizeof(int).
		 */
		if (*tc != ']' || lv <= INT_MIN || lv >= INT_MAX) {
			return false;
		}
		*num = (int)lv;
	} else {
		return false;
	}

	/*
	 * Put a null where the opening bracket is; make it easier for the
	 * caller to handle the name.
	 */
	*to = '\0';

	/* Success */
	return true;
}